

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void expand_2i_vec(TCGContext_conflict9 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,
                  uint32_t oprsz,uint32_t tysz,TCGType_conflict type,int64_t c,_Bool load_dest,
                  _func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_int64_t_conflict9 *fni)

{
  TCGv_vec r;
  TCGv_vec r_00;
  uintptr_t o_1;
  TCGArg o_00;
  uint uVar1;
  uintptr_t o;
  
  r = tcg_temp_new_vec_tricore(tcg_ctx,type);
  r_00 = tcg_temp_new_vec_tricore(tcg_ctx,type);
  if (oprsz != 0) {
    uVar1 = 0;
    do {
      tcg_gen_ld_vec_tricore(tcg_ctx,r,tcg_ctx->cpu_env,(ulong)(aofs + uVar1));
      if (load_dest) {
        o_00 = (TCGArg)(dofs + uVar1);
        tcg_gen_ld_vec_tricore(tcg_ctx,r_00,tcg_ctx->cpu_env,o_00);
      }
      else {
        o_00 = (TCGArg)(dofs + uVar1);
      }
      (*fni)(tcg_ctx,vece,r_00,r,c);
      tcg_gen_st_vec_tricore(tcg_ctx,r_00,tcg_ctx->cpu_env,o_00);
      uVar1 = uVar1 + tysz;
    } while (uVar1 < oprsz);
  }
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(r + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(r_00 + (long)tcg_ctx));
  return;
}

Assistant:

static void expand_2i_vec(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                          uint32_t oprsz, uint32_t tysz, TCGType type,
                          int64_t c, bool load_dest,
                          void (*fni)(TCGContext *, unsigned, TCGv_vec, TCGv_vec, int64_t))
{
    TCGv_vec t0 = tcg_temp_new_vec(tcg_ctx, type);
    TCGv_vec t1 = tcg_temp_new_vec(tcg_ctx, type);
    uint32_t i;

    for (i = 0; i < oprsz; i += tysz) {
        tcg_gen_ld_vec(tcg_ctx, t0, tcg_ctx->cpu_env, aofs + i);
        if (load_dest) {
            tcg_gen_ld_vec(tcg_ctx, t1, tcg_ctx->cpu_env, dofs + i);
        }
        fni(tcg_ctx, vece, t1, t0, c);
        tcg_gen_st_vec(tcg_ctx, t1, tcg_ctx->cpu_env, dofs + i);
    }
    tcg_temp_free_vec(tcg_ctx, t0);
    tcg_temp_free_vec(tcg_ctx, t1);
}